

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alloc.h
# Opt level: O2

void __thiscall
Gluco::RegionAllocator<unsigned_int>::capacity(RegionAllocator<unsigned_int> *this,uint32_t min_cap)

{
  uint uVar1;
  undefined8 uVar2;
  uint *puVar3;
  int *piVar4;
  uint uVar5;
  
  uVar1 = this->cap;
  uVar5 = uVar1;
  if (min_cap <= uVar1) {
    return;
  }
  do {
    if (min_cap <= uVar5) {
      puVar3 = (uint *)realloc(this->memory,(ulong)uVar5 << 2);
      if ((puVar3 != (uint *)0x0) || (piVar4 = __errno_location(), *piVar4 != 0xc)) {
        this->memory = puVar3;
        return;
      }
      break;
    }
    uVar5 = uVar5 + ((uVar5 >> 3) + (uVar5 >> 1) & 0xfffffffe) + 2;
    this->cap = uVar5;
  } while (uVar1 < uVar5);
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&OutOfMemoryException::typeinfo,0);
}

Assistant:

void RegionAllocator<T>::capacity(uint32_t min_cap)
{
    if (cap >= min_cap) return;

    uint32_t prev_cap = cap;
    while (cap < min_cap){
        // NOTE: Multiply by a factor (13/8) without causing overflow, then add 2 and make the
        // result even by clearing the least significant bit. The resulting sequence of capacities
        // is carefully chosen to hit a maximum capacity that is close to the '2^32-1' limit when
        // using 'uint32_t' as indices so that as much as possible of this space can be used.
        uint32_t delta = ((cap >> 1) + (cap >> 3) + 2) & ~1;
        cap += delta;

        if (cap <= prev_cap)
            throw OutOfMemoryException();
    }
    //printf(" .. (%p) cap = %u\n", this, cap);

    assert(cap > 0);
    memory = (T*)xrealloc(memory, sizeof(T)*cap);
}